

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void WindowSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  int iVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindowSettings *this;
  char *pcVar3;
  ImGuiTextBuffer *in_RDX;
  undefined8 *in_RSI;
  char *in_RDI;
  char *settings_name;
  ImGuiWindowSettings *settings_1;
  ImGuiWindowSettings *settings;
  ImGuiWindow *window;
  int i;
  ImGuiContext *g;
  int in_stack_ffffffffffffff9c;
  ImVector<ImGuiWindow_*> *in_stack_ffffffffffffffa0;
  ImGuiTextBuffer *this_00;
  ImGuiWindowSettings *in_stack_ffffffffffffffa8;
  ImGuiWindowSettings *in_stack_ffffffffffffffb8;
  ImVec2ih in_stack_ffffffffffffffc0;
  ImVec2ih in_stack_ffffffffffffffc4;
  ImGuiWindowSettings *in_stack_ffffffffffffffc8;
  ImGuiWindow *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar4;
  
  iVar4 = 0;
  do {
    if (iVar4 == *(int *)(in_RDI + 0x1a28)) {
      this_00 = in_RDX;
      iVar1 = ImGuiTextBuffer::size(in_RDX);
      ImChunkStream<ImGuiWindowSettings>::size
                ((ImChunkStream<ImGuiWindowSettings> *)(in_RDI + 0x2fc8));
      ImGuiTextBuffer::reserve(this_00,iVar1);
      this = ImChunkStream<ImGuiWindowSettings>::begin
                       ((ImChunkStream<ImGuiWindowSettings> *)(in_RDI + 0x2fc8));
      while (this != (ImGuiWindowSettings *)0x0) {
        pcVar3 = ImGuiWindowSettings::GetName(this);
        ImGuiTextBuffer::appendf(in_RDX,"[%s][%s]\n",*in_RSI,pcVar3);
        ImGuiTextBuffer::appendf
                  (in_RDX,"Pos=%d,%d\n",(ulong)(uint)(int)(this->Pos).x,
                   (ulong)(uint)(int)(this->Pos).y);
        ImGuiTextBuffer::appendf
                  (in_RDX,"Size=%d,%d\n",(ulong)(uint)(int)(this->Size).x,
                   (ulong)(uint)(int)(this->Size).y);
        ImGuiTextBuffer::appendf(in_RDX,"Collapsed=%d\n",(ulong)(this->Collapsed & 1));
        ImGuiTextBuffer::append
                  ((ImGuiTextBuffer *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        this = ImChunkStream<ImGuiWindowSettings>::next_chunk
                         ((ImChunkStream<ImGuiWindowSettings> *)
                          CONCAT44(iVar4,in_stack_ffffffffffffffd8),
                          (ImGuiWindowSettings *)in_stack_ffffffffffffffd0);
      }
      return;
    }
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[]
                        (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    in_stack_ffffffffffffffd0 = *ppIVar2;
    if ((in_stack_ffffffffffffffd0->Flags & 0x100U) == 0) {
      if (in_stack_ffffffffffffffd0->SettingsOffset == -1) {
        in_stack_ffffffffffffffa8 =
             ImGui::FindWindowSettings((ImGuiID)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      }
      else {
        in_stack_ffffffffffffffa8 =
             ImChunkStream<ImGuiWindowSettings>::ptr_from_offset
                       ((ImChunkStream<ImGuiWindowSettings> *)in_stack_ffffffffffffffa0,
                        in_stack_ffffffffffffff9c);
      }
      in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffa8;
      if (in_stack_ffffffffffffffa8 == (ImGuiWindowSettings *)0x0) {
        in_stack_ffffffffffffffc8 = ImGui::CreateNewWindowSettings(in_RDI);
        iVar1 = ImChunkStream<ImGuiWindowSettings>::offset_from_ptr
                          ((ImChunkStream<ImGuiWindowSettings> *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           in_stack_ffffffffffffffb8);
        in_stack_ffffffffffffffd0->SettingsOffset = iVar1;
      }
      if (in_stack_ffffffffffffffc8->ID != in_stack_ffffffffffffffd0->ID) {
        __assert_fail("settings->ID == window->ID",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                      ,0x26d1,
                      "void WindowSettingsHandler_WriteAll(ImGuiContext *, ImGuiSettingsHandler *, ImGuiTextBuffer *)"
                     );
      }
      ImVec2ih::ImVec2ih((ImVec2ih *)&stack0xffffffffffffffc4,
                         (short)(int)(in_stack_ffffffffffffffd0->Pos).x,
                         (short)(int)(in_stack_ffffffffffffffd0->Pos).y);
      in_stack_ffffffffffffffc8->Pos = in_stack_ffffffffffffffc4;
      ImVec2ih::ImVec2ih((ImVec2ih *)&stack0xffffffffffffffc0,
                         (short)(int)(in_stack_ffffffffffffffd0->SizeFull).x,
                         (short)(int)(in_stack_ffffffffffffffd0->SizeFull).y);
      in_stack_ffffffffffffffc8->Size = in_stack_ffffffffffffffc0;
      in_stack_ffffffffffffffc8->Collapsed = (bool)(in_stack_ffffffffffffffd0->Collapsed & 1);
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

static void WindowSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsOffset != -1) ? g.SettingsWindows.ptr_from_offset(window->SettingsOffset) : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih((short)window->Pos.x, (short)window->Pos.y);
        settings->Size = ImVec2ih((short)window->SizeFull.x, (short)window->SizeFull.y);
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.size() * 6); // ballpark reserve
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
    {
        const char* settings_name = settings->GetName();
        buf->appendf("[%s][%s]\n", handler->TypeName, settings_name);
        buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        buf->append("\n");
    }
}